

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O0

void duckdb::TupleDataTemplatedScatter<long>
               (Vector *param_1,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *layout,Vector *row_locations,
               Vector *heap_locations,idx_t col_idx,UnifiedVectorFormat *param_9,
               vector<duckdb::TupleDataScatterFunction,_true> *param_10)

{
  bool bVar1;
  idx_t iVar2;
  ulong in_RCX;
  SelectionVector *in_RDX;
  long in_RSI;
  TupleDataLayout *in_R8;
  idx_t in_stack_00000010;
  idx_t source_idx_1;
  idx_t i_1;
  idx_t source_idx;
  idx_t i;
  value_type offset_in_row;
  idx_t idx_in_entry;
  idx_t entry_idx;
  uchar **target_heap_locations;
  uchar **target_locations;
  ValidityMask *validity;
  long *data;
  SelectionVector *source_sel;
  UnifiedVectorFormat *source_data;
  data_ptr_t *in_stack_ffffffffffffff28;
  vector<unsigned_long,_true> *in_stack_ffffffffffffff30;
  SelectionVector *pSVar3;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff38;
  TemplatedValidityMask<unsigned_char> *in_stack_ffffffffffffff40;
  ulong local_90;
  ulong local_80;
  idx_t local_70;
  idx_t local_68;
  uchar **local_60;
  uchar **local_58;
  TemplatedValidityMask<unsigned_long> *local_50;
  long *local_48;
  SelectionVector *local_40;
  UnifiedVectorFormat *local_38;
  TupleDataLayout *local_28;
  ulong local_20;
  SelectionVector *local_18;
  
  local_38 = (UnifiedVectorFormat *)(in_RSI + 0x20);
  local_40 = local_38->sel;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_48 = UnifiedVectorFormat::GetData<long>(local_38);
  local_50 = &(local_38->validity).super_TemplatedValidityMask<unsigned_long>;
  local_58 = FlatVector::GetData<unsigned_char*>((Vector *)0x1658204);
  local_60 = FlatVector::GetData<unsigned_char*>((Vector *)0x1658219);
  TemplatedValidityMask<unsigned_char>::GetEntryIndex(in_stack_00000010,&local_68,&local_70);
  TupleDataLayout::GetOffsets(local_28);
  vector<unsigned_long,_true>::operator[]
            (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
  if (bVar1) {
    for (local_80 = 0; local_80 < local_20; local_80 = local_80 + 1) {
      pSVar3 = local_40;
      iVar2 = SelectionVector::get_index(local_18,local_80);
      SelectionVector::get_index(pSVar3,iVar2);
      TupleDataValueStore<long>
                ((long *)in_stack_ffffffffffffff40,(data_ptr_t *)pSVar3,
                 (idx_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  else {
    for (local_90 = 0; local_90 < local_20; local_90 = local_90 + 1) {
      pSVar3 = local_40;
      iVar2 = SelectionVector::get_index(local_18,local_90);
      SelectionVector::get_index(pSVar3,iVar2);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff38,(idx_t)pSVar3);
      if (bVar1) {
        TupleDataValueStore<long>
                  ((long *)in_stack_ffffffffffffff40,(data_ptr_t *)in_stack_ffffffffffffff38,
                   (idx_t)pSVar3,in_stack_ffffffffffffff28);
      }
      else {
        NullValue<long>();
        TupleDataValueStore<long>
                  ((long *)in_stack_ffffffffffffff40,(data_ptr_t *)in_stack_ffffffffffffff38,
                   (idx_t)pSVar3,in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff28 = (data_ptr_t *)local_58[local_90];
        TupleDataLayout::ColumnCount((TupleDataLayout *)0x1658425);
        TemplatedValidityMask<unsigned_char>::TemplatedValidityMask
                  (in_stack_ffffffffffffff40,(uchar *)in_stack_ffffffffffffff38,(idx_t)pSVar3);
        TemplatedValidityMask<unsigned_char>::SetInvalidUnsafe
                  ((TemplatedValidityMask<unsigned_char> *)&stack0xffffffffffffff40,local_68,
                   local_70);
        TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
                  ((TemplatedValidityMask<unsigned_char> *)0x1658454);
      }
    }
  }
  return;
}

Assistant:

static void TupleDataTemplatedScatter(const Vector &, const TupleDataVectorFormat &source_format,
                                      const SelectionVector &append_sel, const idx_t append_count,
                                      const TupleDataLayout &layout, const Vector &row_locations,
                                      Vector &heap_locations, const idx_t col_idx, const UnifiedVectorFormat &,
                                      const vector<TupleDataScatterFunction> &) {
	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto data = UnifiedVectorFormat::GetData<T>(source_data);
	const auto &validity = source_data.validity;

	// Target
	const auto target_locations = FlatVector::GetData<data_ptr_t>(row_locations);
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	const auto offset_in_row = layout.GetOffsets()[col_idx];
	if (validity.AllValid()) {
		for (idx_t i = 0; i < append_count; i++) {
			const auto source_idx = source_sel.get_index(append_sel.get_index(i));
			TupleDataValueStore<T>(data[source_idx], target_locations[i], offset_in_row, target_heap_locations[i]);
		}
	} else {
		for (idx_t i = 0; i < append_count; i++) {
			const auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (validity.RowIsValid(source_idx)) {
				TupleDataValueStore<T>(data[source_idx], target_locations[i], offset_in_row, target_heap_locations[i]);
			} else {
				TupleDataValueStore<T>(NullValue<T>(), target_locations[i], offset_in_row, target_heap_locations[i]);
				ValidityBytes(target_locations[i], layout.ColumnCount()).SetInvalidUnsafe(entry_idx, idx_in_entry);
			}
		}
	}
}